

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O1

void __thiscall leveldb::SnapshotList::Delete(SnapshotList *this,SnapshotImpl *snapshot)

{
  long lVar1;
  SnapshotImpl *pSVar2;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (snapshot->list_ != this) {
    __assert_fail("snapshot->list_ == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/snapshot.h"
                  ,0x51,"void leveldb::SnapshotList::Delete(const SnapshotImpl *)");
  }
  pSVar2 = snapshot->prev_;
  pSVar2->next_ = snapshot->next_;
  snapshot->next_->prev_ = pSVar2;
  if (snapshot == (SnapshotImpl *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*(snapshot->super_Snapshot)._vptr_Snapshot[1])(snapshot,snapshot,in_RDX,lVar1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Delete(const SnapshotImpl* snapshot) {
#if !defined(NDEBUG)
    assert(snapshot->list_ == this);
#endif  // !defined(NDEBUG)
    snapshot->prev_->next_ = snapshot->next_;
    snapshot->next_->prev_ = snapshot->prev_;
    delete snapshot;
  }